

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_blindfactor.cpp
# Opt level: O3

void __thiscall
BlindFactor_Constractor_hex_err_Test::TestBody(BlindFactor_Constractor_hex_err_Test *this)

{
  bool bVar1;
  BlindFactor blind_factor;
  string local_58;
  BlindFactor local_38;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"112233","");
    cfd::core::BlindFactor::BlindFactor(&local_38,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    local_38._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_0068d500;
    if (local_38.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  testing::Message::Message((Message *)&local_38);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_58,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_blindfactor.cpp"
             ,0x2c,
             "Expected: BlindFactor blind_factor(\"112233\") throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_38);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
  if (local_38._vptr_BlindFactor != (_func_int **)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && (local_38._vptr_BlindFactor != (_func_int **)0x0)) {
      (**(code **)(*local_38._vptr_BlindFactor + 8))();
    }
  }
  return;
}

Assistant:

TEST(BlindFactor, Constractor_hex_err) {
  EXPECT_THROW(BlindFactor blind_factor("112233"), CfdException);
}